

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemRgEa<(moira::Instr)77,(moira::Mode)2,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)2,_(moira::Size)2> dst;
  RegRegList src;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  Align align;
  undefined4 in_stack_ffffffffffffffcc;
  undefined6 in_stack_ffffffffffffffd0;
  RegRegList in_stack_ffffffffffffffd6;
  RegRegList local_1c;
  ushort local_1a;
  u32 *local_18;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)2>
                    ((Moira *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),
                     (u32 *)in_RDI);
  RegRegList::RegRegList(&local_1c,(u16)uVar1);
  Op<(moira::Mode)2,(moira::Size)2>
            ((Ea<(moira::Mode)2,_(moira::Size)2> *)&stack0xffffffffffffffd0,in_RDI,local_1a & 7,
             local_18);
  pSVar2 = StrWriter::operator<<(local_10);
  pSVar2 = StrWriter::operator<<(pSVar2);
  align.raw = (in_RDI->tab).raw;
  StrWriter::operator<<(pSVar2,align);
  pSVar2 = StrWriter::operator<<
                     ((StrWriter *)CONCAT44(in_stack_ffffffffffffffcc,align.raw),
                      in_stack_ffffffffffffffd6);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT26(in_stack_ffffffffffffffd6.raw,in_stack_ffffffffffffffd0),
             (Ea<(moira::Mode)2,_(moira::Size)2> *)CONCAT44(in_stack_ffffffffffffffcc,align.raw));
  return;
}

Assistant:

void
Moira::dasmMovemRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = RegRegList ( dasmRead<Word>(addr)       );
    auto dst = Op <M,S>   ( _____________xxx(op), addr );

    if (M == 4) { src.raw = REVERSE_16(src.raw); }
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}